

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_chunked_sequence.cpp
# Opt level: O2

void __thiscall
ChunkedSequence_EmplaceBack_Test::~ChunkedSequence_EmplaceBack_Test
          (ChunkedSequence_EmplaceBack_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (ChunkedSequence, EmplaceBack) {
    cseq_simple cs;
    simple const & a = cs.emplace_back (17);
    simple const & b = cs.emplace_back (19);
    simple const & c = cs.emplace_back (23);
    EXPECT_EQ (cs.size (), 3U);
    EXPECT_EQ (a.get (), 17);
    EXPECT_EQ (b.get (), 19);
    EXPECT_EQ (c.get (), 23);
}